

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O1

double __thiscall libDAI::NDP::run(NDP *this)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  Exception *this_00;
  size_t i_th_var;
  double dVar7;
  tms ts_before;
  tms ts_after;
  tms local_90;
  string local_70;
  tms local_50;
  long *plVar2;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  this->bestValue = -INFINITY;
  if (1 < (this->Props).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&local_90,this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90.tms_utime,local_90.tms_stime);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"...",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((clock_t *)local_90.tms_utime != &local_90.tms_cutime) {
      operator_delete((void *)local_90.tms_utime,local_90.tms_cutime + 1);
    }
  }
  if (2 < (this->Props).verbose) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  times(&local_90);
  ComputeHeuristicVariableOrdering(this);
  lVar4 = (**(code **)(*plVar2 + 0x28))(plVar2);
  if (lVar4 != 0) {
    i_th_var = 0;
    do {
      if (0.0 < this->_m_deadlineInSeconds) {
        times(&local_50);
        lVar4 = local_50.tms_utime - local_90.tms_utime;
        lVar5 = sysconf(2);
        if (this->_m_deadlineInSeconds < (double)lVar4 / (double)lVar5) {
          this_00 = (Exception *)__cxa_allocate_exception(0x10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"ndp.cpp, line 198","");
          Exception::Exception(this_00,0xb,&local_70);
          __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      EliminateVariable(this,i_th_var);
      i_th_var = i_th_var + 1;
      uVar6 = (**(code **)(*plVar2 + 0x28))(plVar2);
    } while (i_th_var < uVar6);
  }
  dVar7 = ConstructOptimalAssignments(this);
  if ((this->Props).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"NDP done. Induced width was ",0x1c);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return dVar7;
}

Assistant:

double NDP::run() {
        const FactorGraph& g = grm();
        bestValue = -INFINITY;
        if( Props.verbose >= 2 )
            cout << "Starting " << identify() << "..."<<endl;
        if( Props.verbose >= 3)
           cout << endl; 

        tms ts_before, ts_after;
        times(&ts_before);

        //struct timeval start_time, cur_time;
        //if(gettimeofday(&start_time, NULL) != 0)
            //throw "Error with gettimeofday";
        //clock_t tic = toc();

        // 0) some initialization

        // 1) create a heuristic ordering of the variables to eliminate
        ComputeHeuristicVariableOrdering();
        
        // 2) eliminate the variables one by one
        for(size_t i=0; i < g.nrVars(); i++)
        {
            // make sure we don't use too much time
            if(_m_deadlineInSeconds>0)
            {
                times(&ts_after);
                clock_t utime = ts_after.tms_utime -
                    ts_before.tms_utime;
                double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
                if(timeSpentInS>_m_deadlineInSeconds)
                    DAI_THROW(INTERNAL_ERROR);
            }
            EliminateVariable(i);
        }
        // 3) construct the k optimal assignments
        double val = ConstructOptimalAssignments();
        if(Props.verbose >= 1)
            cout << "NDP done. Induced width was "<<_m_induced_width<<endl;
        
        return(val);
    }